

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::AddLocationAndComponentDecorations
          (InterfaceVariableScalarReplacement *this,NestedCompositeComponents *vars,
          uint32_t *location,uint32_t component)

{
  bool bVar1;
  uint32_t var_id_00;
  Instruction *this_00;
  IRContext *pIVar2;
  DecorationManager *pDVar3;
  vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
  *this_01;
  reference vars_00;
  NestedCompositeComponents *var;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
  *__range2;
  uint32_t var_id;
  uint32_t component_local;
  uint32_t *location_local;
  NestedCompositeComponents *vars_local;
  InterfaceVariableScalarReplacement *this_local;
  
  bVar1 = NestedCompositeComponents::HasMultipleComponents(vars);
  if (bVar1) {
    this_01 = NestedCompositeComponents::GetComponents(vars);
    __end2 = std::
             vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
             ::begin(this_01);
    var = (NestedCompositeComponents *)
          std::
          vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
          ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents_*,_std::vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>_>
                                       *)&var), bVar1) {
      vars_00 = __gnu_cxx::
                __normal_iterator<const_spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents_*,_std::vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>_>
                ::operator*(&__end2);
      AddLocationAndComponentDecorations(this,vars_00,location,component);
      __gnu_cxx::
      __normal_iterator<const_spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents_*,_std::vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    this_00 = NestedCompositeComponents::GetComponentVariable(vars);
    var_id_00 = opt::Instruction::result_id(this_00);
    pIVar2 = Pass::context(&this->super_Pass);
    pDVar3 = IRContext::get_decoration_mgr(pIVar2);
    anon_unknown_0::CreateDecoration(pDVar3,var_id_00,DecorationLocation,*location);
    pIVar2 = Pass::context(&this->super_Pass);
    pDVar3 = IRContext::get_decoration_mgr(pIVar2);
    anon_unknown_0::CreateDecoration(pDVar3,var_id_00,Component,component);
    *location = *location + 1;
  }
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::AddLocationAndComponentDecorations(
    const NestedCompositeComponents& vars, uint32_t* location,
    uint32_t component) {
  if (!vars.HasMultipleComponents()) {
    uint32_t var_id = vars.GetComponentVariable()->result_id();
    CreateDecoration(context()->get_decoration_mgr(), var_id,
                     spv::Decoration::Location, *location);
    CreateDecoration(context()->get_decoration_mgr(), var_id,
                     spv::Decoration::Component, component);
    ++(*location);
    return;
  }
  for (const auto& var : vars.GetComponents()) {
    AddLocationAndComponentDecorations(var, location, component);
  }
}